

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUITabControl.cpp
# Opt level: O3

void __thiscall irr::gui::CGUITabControl::draw(CGUITabControl *this)

{
  IGUIButton *pIVar1;
  IGUITab *pIVar2;
  char cVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  undefined4 uVar7;
  long *plVar8;
  long *plVar9;
  long *plVar10;
  wchar_t *pwVar11;
  pointer ppIVar12;
  undefined8 *puVar13;
  rect<int> *prVar14;
  wchar_t *pwVar15;
  ulong uVar16;
  undefined8 uVar17;
  long lVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  ulong uVar22;
  rect<int> frameRect;
  rect<int> tr;
  rect<int> textClipRect;
  rect<int> *in_stack_ffffffffffffff18;
  uint *puVar23;
  uint local_d8;
  int iStack_d4;
  uint uStack_d0;
  int iStack_cc;
  uint local_c4;
  rect<int> *local_c0;
  ulong local_b8;
  undefined1 *local_b0;
  IGUITab *local_a8;
  ulong local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  long *local_88;
  string<wchar_t> local_80;
  long *local_60;
  ulong local_58;
  long *local_50;
  rect<int> local_48;
  
  if (this->field_0xa0 != '\x01') {
    return;
  }
  plVar8 = (long *)(**(code **)(**(long **)&this->field_0x128 + 0x60))();
  if (plVar8 == (long *)0x0) {
    return;
  }
  plVar9 = (long *)(**(code **)(*plVar8 + 0x30))(plVar8,0);
  plVar10 = (long *)(**(code **)(**(long **)&this->field_0x128 + 0x30))();
  local_d8 = *(uint *)&this->field_0x40;
  iStack_d4 = *(int *)&this->field_0x44;
  uStack_d0 = *(uint *)&this->field_0x48;
  iStack_cc = *(int *)&this->field_0x4c;
  if ((this->Tabs).m_data.
      super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->Tabs).m_data.
      super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar4 = (**(code **)*plVar8)(plVar8,3);
    (**(code **)(*plVar10 + 0x198))(plVar10,uVar4,&local_d8,&this->field_0x50);
  }
  uVar4 = (undefined4)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  if (plVar9 == (long *)0x0) {
    return;
  }
  if (this->VerticalAlignment == EGUIA_UPPERLEFT) {
    iStack_d4 = iStack_d4 + 2;
    iStack_cc = iStack_d4 + this->TabHeight;
  }
  else {
    iStack_d4 = ~this->TabHeight + iStack_cc;
    iStack_cc = iStack_cc + -2;
  }
  local_b0 = &this->field_0x40;
  local_98 = 0;
  uStack_90 = 0;
  uVar22 = (ulong)(uint)this->CurrentScrollTabIndex;
  ppIVar12 = (this->Tabs).m_data.
             super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_58 = uVar22;
  uVar7 = 0;
  if ((uint)this->CurrentScrollTabIndex <
      (uint)((ulong)((long)(this->Tabs).m_data.
                           super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar12) >> 3)) {
    local_a0 = 0;
    local_c0 = (rect<int> *)&this->field_0x50;
    local_b8 = 0;
    local_a8 = (IGUITab *)0x0;
    uVar19 = local_d8 + 2;
    local_88 = plVar8;
    local_60 = plVar10;
    local_50 = plVar9;
    do {
      if (ppIVar12[uVar22] == (IGUITab *)0x0) {
        pwVar11 = (wchar_t *)0x0;
      }
      else {
        pwVar11 = (wchar_t *)
                  (**(code **)(*(long *)&(ppIVar12[uVar22]->super_IGUIElement).super_IEventReceiver
                              + 0xa8))();
      }
      pwVar15 = pwVar11;
      iVar5 = (**(code **)(*plVar9 + 8))(plVar9);
      prVar14 = local_c0;
      iVar5 = iVar5 + this->TabExtraWidth;
      iVar6 = this->TabMaxWidth;
      iVar20 = iVar6;
      if (iVar5 < iVar6) {
        iVar20 = iVar5;
      }
      if (iVar6 < 1) {
        iVar20 = iVar5;
      }
      if (this->ScrollControl == true) {
        iVar6 = ((this->UpButton->super_IGUIElement).AbsoluteRect.UpperLeftCorner.X - uVar19) + -2;
        uVar16 = CONCAT71((int7)((ulong)pwVar15 >> 8),iVar6 < iVar20);
        if (iVar6 < iVar20) {
          iVar20 = iVar6;
        }
      }
      else {
        uVar16 = 0;
      }
      uVar21 = iVar20 + uVar19;
      local_d8 = uVar19;
      uStack_d0 = uVar21;
      if (uVar22 == (uint)this->ActiveTabIndex) {
        ppIVar12 = (this->Tabs).m_data.
                   super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        local_a8 = ppIVar12[uVar22];
        local_b8 = (ulong)uVar21;
        local_a0 = (ulong)uVar19;
        plVar9 = local_50;
      }
      else {
        local_c4 = (uint)uVar16;
        (**(code **)(*local_88 + 0x90))(local_88,this,0,&local_d8,local_c0,this->VerticalAlignment);
        local_48.UpperLeftCorner.Y = iStack_d4;
        local_48.UpperLeftCorner.X = local_d8;
        local_48.LowerRightCorner.Y = iStack_cc;
        local_48.LowerRightCorner.X = uStack_d0;
        in_stack_ffffffffffffff18 = &local_48;
        core::rect<int>::clipAgainst(in_stack_ffffffffffffff18,prVar14);
        local_80.str._M_dataplus._M_p = (pointer)&local_80.str.field_2;
        local_80.str._M_string_length = 0;
        local_80.str.field_2._M_local_buf[0] = L'\0';
        core::string<wchar_t>::operator=(&local_80,pwVar11);
        uVar4 = (**(code **)(*(long *)&((this->Tabs).m_data.
                                        super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start[uVar22]->
                                       super_IGUIElement).super_IEventReceiver + 0x148))();
        plVar9 = local_50;
        (**(code **)*local_50)(local_50,&local_80,&local_d8,uVar4,1,1,in_stack_ffffffffffffff18);
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_80.str._M_dataplus._M_p != &local_80.str.field_2) {
          operator_delete(local_80.str._M_dataplus._M_p,
                          CONCAT44(local_80.str.field_2._M_local_buf[1],
                                   local_80.str.field_2._M_local_buf[0]) * 4 + 4);
        }
        ppIVar12 = (this->Tabs).m_data.
                   super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        uVar16 = (ulong)local_c4;
      }
      plVar10 = local_60;
      plVar8 = local_88;
      prVar14 = local_c0;
      uVar4 = (undefined4)((ulong)in_stack_ffffffffffffff18 >> 0x20);
      uVar7 = (undefined4)uVar16;
      uVar22 = uVar22 + 1;
      uVar19 = uVar21;
    } while (uVar22 < ((ulong)((long)(this->Tabs).m_data.
                                     super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar12) >>
                       3 & 0xffffffff) && (uVar16 & 1) == 0);
    if ((((int)local_a0 != 0) && ((int)local_b8 != 0)) && (local_a8 != (IGUITab *)0x0)) {
      local_d8 = (int)local_a0 - 2;
      uStack_d0 = (int)local_b8 + 2;
      local_c4 = uVar7;
      if (this->VerticalAlignment == EGUIA_UPPERLEFT) {
        iStack_d4 = iStack_d4 + -2;
        (**(code **)(*local_88 + 0x90))(local_88,this,1,&local_d8,local_c0,0);
        local_48.UpperLeftCorner.Y = iStack_d4;
        local_48.UpperLeftCorner.X = local_d8;
        local_48.LowerRightCorner.Y = iStack_cc;
        local_48.LowerRightCorner.X = uStack_d0;
        core::rect<int>::clipAgainst(&local_48,prVar14);
        pIVar2 = local_a8;
        pwVar11 = (wchar_t *)
                  (**(code **)(*(long *)&(local_a8->super_IGUIElement).super_IEventReceiver + 0xa8))
                            (local_a8);
        local_80.str._M_dataplus._M_p = (pointer)&local_80.str.field_2;
        local_80.str._M_string_length = 0;
        local_80.str.field_2._M_local_buf[0] = L'\0';
        core::string<wchar_t>::operator=(&local_80,pwVar11);
        uVar4 = (**(code **)(*(long *)&(pIVar2->super_IGUIElement).super_IEventReceiver + 0x148))
                          (pIVar2);
        prVar14 = &local_48;
        (**(code **)*plVar9)(plVar9,&local_80,&local_d8,uVar4,1,1,prVar14);
        uVar4 = (undefined4)((ulong)prVar14 >> 0x20);
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_80.str._M_dataplus._M_p != &local_80.str.field_2) {
          operator_delete(local_80.str._M_dataplus._M_p,
                          CONCAT44(local_80.str.field_2._M_local_buf[1],
                                   local_80.str.field_2._M_local_buf[0]) * 4 + 4);
        }
        local_98._0_4_ = *(undefined4 *)&this->field_0x40;
        uStack_90._0_4_ = (int)local_a0 + -1;
        local_98._4_4_ = iStack_cc + -1;
        uStack_90._4_4_ = iStack_cc;
        uVar7 = (**(code **)*plVar8)(plVar8,3);
        prVar14 = local_c0;
        (**(code **)(*plVar10 + 0x198))(plVar10,uVar7,&local_98,local_c0);
        local_98 = CONCAT44(local_98._4_4_,(int)local_b8);
        uStack_90 = CONCAT44(uStack_90._4_4_,*(undefined4 *)&this->field_0x48);
        puVar13 = (undefined8 *)*plVar8;
        uVar17 = 3;
      }
      else {
        iStack_cc = iStack_cc + 2;
        (**(code **)(*local_88 + 0x90))(local_88,this,1,&local_d8,local_c0);
        pIVar2 = local_a8;
        pwVar11 = (wchar_t *)
                  (**(code **)(*(long *)&(local_a8->super_IGUIElement).super_IEventReceiver + 0xa8))
                            (local_a8);
        local_80.str._M_dataplus._M_p = (pointer)&local_80.str.field_2;
        local_80.str._M_string_length = 0;
        local_80.str.field_2._M_local_buf[0] = L'\0';
        core::string<wchar_t>::operator=(&local_80,pwVar11);
        uVar4 = (**(code **)(*(long *)&(pIVar2->super_IGUIElement).super_IEventReceiver + 0x148))
                          (pIVar2);
        puVar23 = &local_d8;
        (**(code **)*plVar9)(plVar9,&local_80,puVar23,uVar4,1,1,puVar23);
        uVar4 = (undefined4)((ulong)puVar23 >> 0x20);
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_80.str._M_dataplus._M_p != &local_80.str.field_2) {
          operator_delete(local_80.str._M_dataplus._M_p,
                          CONCAT44(local_80.str.field_2._M_local_buf[1],
                                   local_80.str.field_2._M_local_buf[0]) * 4 + 4);
        }
        local_98._0_4_ = *(undefined4 *)&this->field_0x40;
        uStack_90._0_4_ = (int)local_a0 + -1;
        local_98._4_4_ = iStack_d4 + -1;
        uStack_90._4_4_ = iStack_d4;
        uVar7 = (**(code **)*plVar8)(plVar8,0);
        prVar14 = local_c0;
        (**(code **)(*plVar10 + 0x198))(plVar10,uVar7,&local_98,local_c0);
        local_98 = CONCAT44(local_98._4_4_,(int)local_b8);
        uStack_90 = CONCAT44(uStack_90._4_4_,*(undefined4 *)&this->field_0x48);
        puVar13 = (undefined8 *)*plVar8;
        uVar17 = 0;
      }
      uVar7 = (*(code *)*puVar13)(plVar8,uVar17);
      lVar18 = *plVar10;
      goto LAB_002271fc;
    }
  }
  local_c4 = uVar7;
  local_98 = CONCAT44(iStack_cc + -1,*(undefined4 *)&this->field_0x40);
  uStack_90 = CONCAT44(iStack_cc,*(undefined4 *)&this->field_0x48);
  if (this->VerticalAlignment == EGUIA_UPPERLEFT) {
    uVar7 = (**(code **)*plVar8)(plVar8,3);
    prVar14 = (rect<int> *)&this->field_0x50;
    lVar18 = *plVar10;
  }
  else {
    local_98 = CONCAT44(iStack_d4 + -1,*(undefined4 *)&this->field_0x40);
    uStack_90 = CONCAT44(iStack_d4,*(undefined4 *)&this->field_0x48);
    uVar7 = (**(code **)*plVar8)(plVar8,0);
    prVar14 = (rect<int> *)&this->field_0x50;
    lVar18 = *plVar10;
  }
LAB_002271fc:
  (**(code **)(lVar18 + 0x198))(plVar10,uVar7,&local_98,prVar14);
  (**(code **)(*plVar8 + 0x98))
            (plVar8,this,this->Border,this->FillBackground,local_b0,&this->field_0x50,
             CONCAT44(uVar4,this->TabHeight),this->VerticalAlignment);
  pIVar1 = this->UpButton;
  if (pIVar1 != (IGUIButton *)0x0) {
    (*(pIVar1->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x13])
              (pIVar1,(ulong)(0 < (int)local_58));
  }
  pIVar1 = this->DownButton;
  if (pIVar1 != (IGUIButton *)0x0) {
    (*(pIVar1->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x13])
              (pIVar1,(ulong)(byte)local_c4);
  }
  refreshSprites(this);
  cVar3 = (**(code **)(*(long *)this + 0x68))(this);
  if (cVar3 != '\0') {
    for (puVar13 = *(undefined8 **)&this->field_0x8; puVar13 != (undefined8 *)&this->field_0x8;
        puVar13 = (undefined8 *)*puVar13) {
      (**(code **)(*(long *)puVar13[2] + 0x50))();
    }
  }
  return;
}

Assistant:

void CGUITabControl::draw()
{
	if (!IsVisible)
		return;

	IGUISkin *skin = Environment->getSkin();
	if (!skin)
		return;

	IGUIFont *font = skin->getFont();
	video::IVideoDriver *driver = Environment->getVideoDriver();

	core::rect<s32> frameRect(AbsoluteRect);

	// some empty background as placeholder when there are no tabs
	if (Tabs.empty())
		driver->draw2DRectangle(skin->getColor(EGDC_3D_HIGH_LIGHT), frameRect, &AbsoluteClippingRect);

	if (!font)
		return;

	// tab button bar can be above or below the tabs
	if (VerticalAlignment == EGUIA_UPPERLEFT) {
		frameRect.UpperLeftCorner.Y += 2;
		frameRect.LowerRightCorner.Y = frameRect.UpperLeftCorner.Y + TabHeight;
	} else {
		frameRect.UpperLeftCorner.Y = frameRect.LowerRightCorner.Y - TabHeight - 1;
		frameRect.LowerRightCorner.Y -= 2;
	}

	core::rect<s32> tr;
	s32 pos = frameRect.UpperLeftCorner.X + 2;

	bool needLeftScroll = CurrentScrollTabIndex > 0;
	bool needRightScroll = false;

	// left and right pos of the active tab
	s32 left = 0;
	s32 right = 0;

	// const wchar_t* activetext = 0;
	IGUITab *activeTab = 0;

	// Draw all tab-buttons except the active one
	for (u32 i = CurrentScrollTabIndex; i < Tabs.size() && !needRightScroll; ++i) {
		// get Text
		const wchar_t *text = 0;
		if (Tabs[i])
			text = Tabs[i]->getText();

		// get text length
		s32 len = calcTabWidth(font, text);
		if (ScrollControl) {
			s32 space = UpButton->getAbsolutePosition().UpperLeftCorner.X - 2 - pos;
			if (space < len) {
				needRightScroll = true;
				len = space;
			}
		}

		frameRect.LowerRightCorner.X += len;
		frameRect.UpperLeftCorner.X = pos;
		frameRect.LowerRightCorner.X = frameRect.UpperLeftCorner.X + len;

		pos += len;

		if ((s32)i == ActiveTabIndex) {
			// for active button just remember values
			left = frameRect.UpperLeftCorner.X;
			right = frameRect.LowerRightCorner.X;
			// activetext = text;
			activeTab = Tabs[i];
		} else {
			skin->draw3DTabButton(this, false, frameRect, &AbsoluteClippingRect, VerticalAlignment);

			// draw text
			core::rect<s32> textClipRect(frameRect); // TODO: exact size depends on borders in draw3DTabButton which we don't get with current interface
			textClipRect.clipAgainst(AbsoluteClippingRect);
			font->draw(text, frameRect, Tabs[i]->getTextColor(),
					true, true, &textClipRect);
		}
	}

	// Draw active tab button
	// Drawn later than other buttons because it draw over the buttons before/after it.
	if (left != 0 && right != 0 && activeTab != 0) {
		// draw upper highlight frame
		if (VerticalAlignment == EGUIA_UPPERLEFT) {
			frameRect.UpperLeftCorner.X = left - 2;
			frameRect.LowerRightCorner.X = right + 2;
			frameRect.UpperLeftCorner.Y -= 2;

			skin->draw3DTabButton(this, true, frameRect, &AbsoluteClippingRect, VerticalAlignment);

			// draw text
			core::rect<s32> textClipRect(frameRect); // TODO: exact size depends on borders in draw3DTabButton which we don't get with current interface
			textClipRect.clipAgainst(AbsoluteClippingRect);
			font->draw(activeTab->getText(), frameRect, activeTab->getTextColor(),
					true, true, &textClipRect);

			tr.UpperLeftCorner.X = AbsoluteRect.UpperLeftCorner.X;
			tr.LowerRightCorner.X = left - 1;
			tr.UpperLeftCorner.Y = frameRect.LowerRightCorner.Y - 1;
			tr.LowerRightCorner.Y = frameRect.LowerRightCorner.Y;
			driver->draw2DRectangle(skin->getColor(EGDC_3D_HIGH_LIGHT), tr, &AbsoluteClippingRect);

			tr.UpperLeftCorner.X = right;
			tr.LowerRightCorner.X = AbsoluteRect.LowerRightCorner.X;
			driver->draw2DRectangle(skin->getColor(EGDC_3D_HIGH_LIGHT), tr, &AbsoluteClippingRect);
		} else {
			frameRect.UpperLeftCorner.X = left - 2;
			frameRect.LowerRightCorner.X = right + 2;
			frameRect.LowerRightCorner.Y += 2;

			skin->draw3DTabButton(this, true, frameRect, &AbsoluteClippingRect, VerticalAlignment);

			// draw text
			font->draw(activeTab->getText(), frameRect, activeTab->getTextColor(),
					true, true, &frameRect);

			tr.UpperLeftCorner.X = AbsoluteRect.UpperLeftCorner.X;
			tr.LowerRightCorner.X = left - 1;
			tr.UpperLeftCorner.Y = frameRect.UpperLeftCorner.Y - 1;
			tr.LowerRightCorner.Y = frameRect.UpperLeftCorner.Y;
			driver->draw2DRectangle(skin->getColor(EGDC_3D_DARK_SHADOW), tr, &AbsoluteClippingRect);

			tr.UpperLeftCorner.X = right;
			tr.LowerRightCorner.X = AbsoluteRect.LowerRightCorner.X;
			driver->draw2DRectangle(skin->getColor(EGDC_3D_DARK_SHADOW), tr, &AbsoluteClippingRect);
		}
	} else {
		// No active tab
		// Draw a line separating button bar from tab area
		tr.UpperLeftCorner.X = AbsoluteRect.UpperLeftCorner.X;
		tr.LowerRightCorner.X = AbsoluteRect.LowerRightCorner.X;
		tr.UpperLeftCorner.Y = frameRect.LowerRightCorner.Y - 1;
		tr.LowerRightCorner.Y = frameRect.LowerRightCorner.Y;

		if (VerticalAlignment == EGUIA_UPPERLEFT) {
			driver->draw2DRectangle(skin->getColor(EGDC_3D_HIGH_LIGHT), tr, &AbsoluteClippingRect);
		} else {
			tr.UpperLeftCorner.Y = frameRect.UpperLeftCorner.Y - 1;
			tr.LowerRightCorner.Y = frameRect.UpperLeftCorner.Y;
			driver->draw2DRectangle(skin->getColor(EGDC_3D_DARK_SHADOW), tr, &AbsoluteClippingRect);
		}
	}

	// drawing some border and background for the tab-area.
	skin->draw3DTabBody(this, Border, FillBackground, AbsoluteRect, &AbsoluteClippingRect, TabHeight, VerticalAlignment);

	// enable scrollcontrols on need
	if (UpButton)
		UpButton->setEnabled(needLeftScroll);
	if (DownButton)
		DownButton->setEnabled(needRightScroll);
	refreshSprites();

	IGUIElement::draw();
}